

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraALU_cpp.h
# Opt level: O0

u32 __thiscall
moira::Moira::bitfield<(moira::Instr)136>(Moira *this,u32 data,u32 offset,u32 width,u32 mask)

{
  bool bVar1;
  i32 iVar2;
  uint uVar3;
  u32 result;
  u32 mask_local;
  u32 width_local;
  u32 offset_local;
  u32 data_local;
  Moira *this_local;
  
  iVar2 = SEXT<4>((ulong)data);
  uVar3 = iVar2 >> (0x20U - (char)width & 0x1f);
  bVar1 = NBIT<4>((ulong)data);
  (this->reg).sr.n = bVar1;
  bVar1 = ZERO<4>((ulong)uVar3);
  (this->reg).sr.z = bVar1;
  (this->reg).sr.v = false;
  (this->reg).sr.c = false;
  return uVar3;
}

Assistant:

u32
Moira::bitfield(u32 data, u32 offset, u32 width, u32 mask)
{
    u32 result = 0;

    switch (I) {

        case Instr::BFCHG:

            result = data ^ mask;

            reg.sr.n = NBIT<Long>(data << offset);
            reg.sr.z = ZERO<Long>(data & mask);
            reg.sr.v = 0;
            reg.sr.c = 0;
            break;

        case Instr::BFCLR:

            result = data & ~mask;

            reg.sr.n = NBIT<Long>(data << offset);
            reg.sr.z = ZERO<Long>(data & mask);
            reg.sr.v = 0;
            reg.sr.c = 0;
            break;

        case Instr::BFSET:

            result = data | mask;

            reg.sr.n = NBIT<Long>(data << offset);
            reg.sr.z = ZERO<Long>(data & mask);
            reg.sr.v = 0;
            reg.sr.c = 0;
            break;

        case Instr::BFEXTS:

            result = SEXT<Long>(data) >> (32 - width);

            reg.sr.n = NBIT<Long>(data);
            reg.sr.z = ZERO<Long>(result);
            reg.sr.v = 0;
            reg.sr.c = 0;
            break;

        case Instr::BFEXTU:

            result = data >> (32 - width);

            reg.sr.n = NBIT<Long>(data);
            reg.sr.z = ZERO<Long>(result);
            reg.sr.v = 0;
            reg.sr.c = 0;
            break;

        case Instr::BFFFO:

            reg.sr.n = NBIT<Long>(data);
            data >>= 32 - width;
            reg.sr.z = ZERO<Long>(data);
            reg.sr.v = 0;
            reg.sr.c = 0;

            result = offset;
            for(u32 bit = 1 << (width - 1); bit && !(data & bit); bit >>= 1) {
                result++;
            }
            break;

        case Instr::BFTST:

            result = 0;

            reg.sr.n = NBIT<Long>(data << offset);
            reg.sr.z = ZERO<Long>(data & mask);
            reg.sr.v = 0;
            reg.sr.c = 0;
            break;

        default:
            break;
    }

    return result;
}